

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O0

void tb(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char buf [128];
  char *exp;
  int len;
  int b;
  int e;
  int h;
  char *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  
  printf("SMBus / I2C tests.");
  uVar1 = i2cOpen(1,0x53,0);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cWriteDevice(uVar1,"",1);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cReadDevice(uVar1,&stack0xffffffffffffff68,1);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cReadByte(uVar1);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cReadByteData(uVar1,0);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cReadByteData(uVar1,0x30);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  sVar4 = strlen("\x1d[aBcDeFgHjKM]");
  iVar3 = (int)sVar4;
  i2cWriteDevice(uVar1,"\x1d[aBcDeFgHjKM]",sVar4 & 0xffffffff);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cWriteDevice(uVar1,"\x1d",1);
  i2cReadDevice(uVar1,&stack0xffffffffffffff68,iVar3 + -1);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  strncmp(&stack0xffffffffffffff68,"[aBcDeFgHjKM]",(long)(iVar3 + -1));
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  iVar2 = strncmp(&stack0xffffffffffffff68,"[aBcDeFgHjKM]",(long)(iVar3 + -1));
  if (iVar2 != 0) {
    printf("got [%.*s] expected [%.*s]\n",(ulong)(iVar3 - 1),&stack0xffffffffffffff68,
           (ulong)(iVar3 - 1),"[aBcDeFgHjKM]");
  }
  i2cWriteByteData(uVar1,0x1d,0xaa);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cReadByteData(uVar1,0x1d);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cWriteByteData(uVar1,0x1d,0x55);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cReadByteData(uVar1,0x1d);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  sVar4 = strlen("[1234567890#]");
  iVar3 = (int)sVar4;
  i2cWriteBlockData(uVar1,0x1c,"[1234567890#]",sVar4 & 0xffffffff);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cWriteDevice(uVar1,"\x1d",1);
  i2cReadDevice(uVar1,&stack0xffffffffffffff68,sVar4 & 0xffffffff);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  strncmp(&stack0xffffffffffffff68,"[1234567890#]",(long)iVar3);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  iVar2 = strncmp(&stack0xffffffffffffff68,"[1234567890#]",(long)iVar3);
  if (iVar2 != 0) {
    printf("got [%.*s] expected [%.*s]\n",sVar4 & 0xffffffff,&stack0xffffffffffffff68,
           sVar4 & 0xffffffff,"[1234567890#]");
  }
  i2cReadI2CBlockData(uVar1,0x1d,&stack0xffffffffffffff68,sVar4 & 0xffffffff);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  strncmp(&stack0xffffffffffffff68,"[1234567890#]",(long)iVar3);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  iVar3 = strncmp(&stack0xffffffffffffff68,"[1234567890#]",(long)iVar3);
  if (iVar3 != 0) {
    printf("got [%.*s] expected [%.*s]\n",sVar4 & 0xffffffff,&stack0xffffffffffffff68,
           sVar4 & 0xffffffff,"[1234567890#]");
  }
  sVar4 = strlen("(-+=;:,<>!%)");
  i2cWriteI2CBlockData(uVar1,0x1d,"(-+=;:,<>!%)",sVar4 & 0xffffffff);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  i2cReadI2CBlockData(uVar1,0x1d,&stack0xffffffffffffff68,sVar4 & 0xffffffff);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  strncmp(&stack0xffffffffffffff68,"(-+=;:,<>!%)",(long)(int)sVar4);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  iVar3 = strncmp(&stack0xffffffffffffff68,"(-+=;:,<>!%)",(long)(int)sVar4);
  if (iVar3 != 0) {
    printf("got [%.*s] expected [%.*s]\n",sVar4 & 0xffffffff,&stack0xffffffffffffff68,
           sVar4 & 0xffffffff,"(-+=;:,<>!%)");
  }
  i2cClose(uVar1);
  CHECK(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void tb()
{
   int h, e, b, len;
   char *exp;
   char buf[128];

   printf("SMBus / I2C tests.");

   /* this test requires an ADXL345 on I2C bus 1 addr 0x53 */

   h = i2cOpen(1, 0x53, 0);
   CHECK(11, 1, h, 0, 0, "i2cOpen");

   e = i2cWriteDevice(h, "\x00", 1); /* move to known register */
   CHECK(11, 2, e, 0, 0, "i2cWriteDevice");

   b = i2cReadDevice(h, buf, 1);
   CHECK(11, 3, b, 1, 0, "i2cReadDevice");
   CHECK(11, 4, buf[0], 0xE5, 0, "i2cReadDevice");

   b = i2cReadByte(h);
   CHECK(11, 5, b, 0xE5, 0, "i2cReadByte");

   b = i2cReadByteData(h, 0);
   CHECK(11, 6, b, 0xE5, 0, "i2cReadByteData");

   b = i2cReadByteData(h, 48);
   CHECK(11, 7, b, 2, 0, "i2cReadByteData");

   exp = "\x1D[aBcDeFgHjKM]";
   len = strlen(exp);

   e = i2cWriteDevice(h, exp, len);
   CHECK(11, 8, e, 0, 0, "i2cWriteDevice");

   e = i2cWriteDevice(h, "\x1D", 1);
   b = i2cReadDevice(h, buf, len-1);
   CHECK(11, 9, b, len-1, 0, "i2cReadDevice");
   CHECK(11, 10, strncmp(buf, exp+1, len-1), 0, 0, "i2cReadDevice");

   if (strncmp(buf, exp+1, len-1))
      printf("got [%.*s] expected [%.*s]\n", len-1, buf, len-1, exp+1);

   e = i2cWriteByteData(h, 0x1d, 0xAA);
   CHECK(11, 11, e, 0, 0, "i2cWriteByteData");

   b = i2cReadByteData(h, 0x1d);
   CHECK(11, 12, b, 0xAA, 0, "i2cReadByteData");

   e = i2cWriteByteData(h, 0x1d, 0x55);
   CHECK(11, 13, e, 0, 0, "i2cWriteByteData");

   b = i2cReadByteData(h, 0x1d);
   CHECK(11, 14, b, 0x55, 0, "i2cReadByteData");

   exp = "[1234567890#]";
   len = strlen(exp);

   e = i2cWriteBlockData(h, 0x1C, exp, len);
   CHECK(11, 15, e, 0, 0, "i2c writeBlockData");

   e = i2cWriteDevice(h, "\x1D", 1);
   b = i2cReadDevice(h, buf, len);
   CHECK(11, 16, b, len, 0, "i2cReadDevice");
   CHECK(11, 17, strncmp(buf, exp, len), 0, 0, "i2cReadDevice");

   if (strncmp(buf, exp, len))
      printf("got [%.*s] expected [%.*s]\n", len, buf, len, exp);

   b = i2cReadI2CBlockData(h, 0x1D, buf, len);
   CHECK(11, 18, b, len, 0, "i2cReadI2CBlockData");
   CHECK(11, 19, strncmp(buf, exp, len), 0, 0, "i2cReadI2CBlockData");

   if (strncmp(buf, exp, len))
      printf("got [%.*s] expected [%.*s]\n", len, buf, len, exp);

   exp = "(-+=;:,<>!%)";
   len = strlen(exp);

   e = i2cWriteI2CBlockData(h, 0x1D, exp, len);
   CHECK(11, 20, e, 0, 0, "i2cWriteI2CBlockData");

   b = i2cReadI2CBlockData(h, 0x1D, buf, len);
   CHECK(11, 21, b, len, 0, "i2cReadI2CBlockData");
   CHECK(11, 22, strncmp(buf, exp, len), 0, 0, "i2cReadI2CBlockData");

   if (strncmp(buf, exp, len))
      printf("got [%.*s] expected [%.*s]\n", len, buf, len, exp);

   e = i2cClose(h);
   CHECK(11, 23, e, 0, 0, "i2cClose");
}